

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O2

void __thiscall xercesc_4_0::QName::setNPrefix(QName *this,XMLCh *prefix,XMLSize_t newLen)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *__dest;
  
  if (this->fPrefixBufSz < newLen || this->fPrefixBufSz == 0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPrefix);
    this->fPrefix = (XMLCh *)0x0;
    this->fPrefixBufSz = newLen + 8;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,newLen * 2 + 0x12);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar1);
    this->fPrefix = __dest;
  }
  else {
    __dest = this->fPrefix;
  }
  memmove(__dest,prefix,newLen * 2);
  this->fPrefix[newLen] = L'\0';
  return;
}

Assistant:

void QName::setNPrefix(const XMLCh* prefix, const XMLSize_t newLen)
{
    if (!fPrefixBufSz || (newLen > fPrefixBufSz))
    {
        fMemoryManager->deallocate(fPrefix); //delete [] fPrefix;
        fPrefix = 0;
        fPrefixBufSz = newLen + 8;
        fPrefix = (XMLCh*) fMemoryManager->allocate
        (
            (fPrefixBufSz + 1) * sizeof(XMLCh)
        ); //new XMLCh[fPrefixBufSz + 1];
    }
    XMLString::moveChars(fPrefix, prefix, newLen);
    fPrefix[newLen] = chNull;
}